

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef __thiscall llvm::sys::path::relative_path(path *this,StringRef path,Style style)

{
  char *pcVar1;
  StringRef SVar2;
  StringRef path_00;
  
  path_00.Length = path.Data;
  path_00.Data = (char *)this;
  SVar2 = root_path(path_00,(Style)path.Length);
  pcVar1 = (char *)SVar2.Length;
  if (path_00.Length <= (char *)SVar2.Length) {
    pcVar1 = path_00.Length;
  }
  SVar2.Length = (long)path_00.Length - (long)pcVar1;
  SVar2.Data = (char *)(this + (long)pcVar1);
  return SVar2;
}

Assistant:

StringRef relative_path(StringRef path, Style style) {
  StringRef root = root_path(path, style);
  return path.substr(root.size());
}